

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void generateRandomString(char *str,size_t size)

{
  int iVar1;
  time_t tVar2;
  ulong uStack_60;
  int key;
  size_t n;
  char charset [63];
  size_t size_local;
  char *str_local;
  
  unique0x1000009e = size;
  memcpy(&n,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789",0x3f);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  if (stack0xffffffffffffffe8 != 0) {
    register0x00000000 = stack0xffffffffffffffe8 - 1;
    for (uStack_60 = 0; uStack_60 < stack0xffffffffffffffe8; uStack_60 = uStack_60 + 1) {
      iVar1 = rand();
      str[uStack_60] = charset[(long)(iVar1 % 0x3e) + -8];
    }
  }
  return;
}

Assistant:

void
generateRandomString(char* str, size_t size)  // size_t: type able to represent the size of any object in bytes
{

    const char charset[] =  "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                            "abcdefghijklmnopqrstuvwxyz"
                            "0123456789";                       // side note: the characters "." and "/" are also allowed as arguments of `crypt()`,
                                                                //            however they're not included in this list because the reservation code
                                                                //            -- that uses this function -- has to be an alphanumeric string.

    // init random number generator
    srand(time(NULL));
    

    if (size) {
        --size;
        for (size_t n = 0; n < size; n++) {
            int key = rand() % (int) (sizeof charset - 1);
            str[n] = charset[key];
        }
        // str[size] = '\0';
    }
    return;
}